

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O3

void capnp::compiler::parseFile(Reader statements,Builder result,ErrorReporter *errorReporter)

{
  short sVar1;
  StructBuilder other;
  StructBuilder other_00;
  Reader statement_00;
  ListElementCount LVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Orphan<capnp::compiler::Declaration> *pOVar5;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *pRVar6;
  Orphan<capnp::compiler::Declaration> *pOVar7;
  undefined8 uVar8;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar9;
  void *pvVar10;
  WirePointer *pWVar11;
  byte bVar12;
  PointerType PVar13;
  int iVar14;
  BuilderArena *pBVar15;
  CapTableBuilder *pCVar16;
  WirePointer i;
  SegmentBuilder *pSVar17;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *ptrCopy;
  long lVar18;
  size_t sVar19;
  char (*params_2) [2];
  ulong uVar20;
  ulong uVar21;
  ElementCount index;
  Orphanage orphanageParam;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> decls;
  Builder annotationsBuilder;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> annotations;
  Builder declsBuilder;
  Builder fileDecl;
  Reader statement;
  CapnpParser parser;
  undefined1 local_358 [16];
  SegmentBuilder *local_348;
  WirePointer *pWStack_340;
  word *local_338;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> local_328;
  OrphanBuilder local_308;
  undefined1 local_2e8 [48];
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_2b8;
  ErrorReporter *local_290;
  bool local_288 [8];
  anon_union_32_1_a8c68091_for_NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>_2
  aStack_280;
  StructBuilder local_258;
  PointerBuilder local_228;
  StructReader local_208;
  SegmentBuilder *local_1d8;
  SegmentBuilder *pSStack_1d0;
  CapnpParser local_1c8;
  
  local_208.dataSize = result._builder.dataSize;
  local_208.pointerCount = result._builder.pointerCount;
  local_208._38_2_ = result._builder._38_2_;
  local_208.data = result._builder.data;
  local_208.pointers = result._builder.pointers;
  local_208.segment = &(result._builder.segment)->super_SegmentReader;
  local_208.capTable = &(result._builder.capTable)->super_CapTableReader;
  pBVar15 = capnp::_::StructBuilder::getArena((StructBuilder *)&local_208);
  pCVar16 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&local_208);
  orphanageParam.capTable = pCVar16;
  orphanageParam.arena = pBVar15;
  local_290 = errorReporter;
  CapnpParser::CapnpParser(&local_1c8,orphanageParam,errorReporter);
  uVar20 = (ulong)statements.reader.elementCount;
  params_2 = (char (*) [2])0x0;
  local_328.builder.ptr =
       (Orphan<capnp::compiler::Declaration> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x20,0,uVar20,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_328.builder.endPtr = local_328.builder.ptr + uVar20;
  local_328.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_2b8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_2b8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_2b8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_208.segment = &(result._builder.segment)->super_SegmentReader;
  local_208.capTable = &(result._builder.capTable)->super_CapTableReader;
  local_208.data = result._builder.pointers;
  local_328.builder.pos = local_328.builder.ptr;
  capnp::_::PointerBuilder::getStruct
            (&local_258,(PointerBuilder *)&local_208,(StructSize)0x80002,(word *)0x0);
  LVar2 = statements.reader.elementCount;
  *(short *)((long)local_258.data + 2) = 0;
  if (statements.reader.elementCount != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_208,&statements.reader,index);
      statement_00._reader.capTable = local_208.capTable;
      statement_00._reader.segment = local_208.segment;
      statement_00._reader.data = local_208.data;
      statement_00._reader.pointers = local_208.pointers;
      statement_00._reader.dataSize = local_208.dataSize;
      statement_00._reader.pointerCount = local_208.pointerCount;
      statement_00._reader._38_2_ = local_208._38_2_;
      statement_00._reader.nestingLimit = local_208.nestingLimit;
      statement_00._reader._44_4_ = local_208._44_4_;
      CapnpParser::parseStatement
                ((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)local_288,&local_1c8,
                 statement_00,&local_1c8.parsers.fileLevelDecl);
      local_358[0] = local_288[0];
      bVar12 = local_288[0];
      if (local_288[0] != false) {
        local_348 = aStack_280.value.builder.segment;
        pWStack_340 = (WirePointer *)aStack_280.value.builder.capTable;
        local_338 = aStack_280.value.builder.location;
        local_358._8_8_ = aStack_280.value.builder.tag.content;
        capnp::_::OrphanBuilder::asStruct
                  ((StructBuilder *)local_288,(OrphanBuilder *)(local_358 + 8),(StructSize)0x80002);
        pWVar11 = local_258.pointers;
        pvVar10 = local_258.data;
        sVar1 = *(short *)((long)&((aStack_280.value.builder.segment)->super_SegmentReader).arena +
                          2);
        if (sVar1 == 0xc) {
          if (*local_258.data == 1) {
            params_2 = (char (*) [2])0x1b;
            (**local_290->_vptr_ErrorReporter)
                      (local_290,
                       (ulong)*(uint *)((long)&((aStack_280.value.builder.segment)->
                                               super_SegmentReader).arena + 4),
                       (ulong)((aStack_280.value.builder.segment)->super_SegmentReader).id.value,
                       "File can only have one ID.");
          }
          else {
            local_1d8 = local_258.segment;
            pSStack_1d0 = (SegmentBuilder *)local_258.capTable;
            local_228.pointer = (WirePointer *)(aStack_280.value.builder.capTable + 5);
            local_228.capTable = (CapTableBuilder *)aStack_280.value.builder.tag.content;
            capnp::_::PointerBuilder::disown((OrphanBuilder *)local_2e8,&local_228);
            local_308.segment = (SegmentBuilder *)local_2e8._8_8_;
            local_308.capTable = (CapTableBuilder *)local_2e8._16_8_;
            local_308.location = (word *)local_2e8._24_8_;
            local_308.tag.content = local_2e8._0_8_;
            *(short *)pvVar10 = 1;
            local_2e8._16_8_ = pWVar11 + 1;
            local_2e8._0_8_ = local_1d8;
            local_2e8._8_8_ = pSStack_1d0;
            capnp::_::PointerBuilder::adopt((PointerBuilder *)local_2e8,&local_308);
            if (local_308.segment != (SegmentBuilder *)0x0) {
              capnp::_::OrphanBuilder::euthanize(&local_308);
            }
            local_2e8._16_8_ = aStack_280.value.builder.capTable + 4;
            local_2e8._0_8_ = CONCAT71(local_288._1_7_,local_288[0]);
            local_2e8._8_8_ = aStack_280.value.builder.tag.content;
            PVar13 = capnp::_::PointerBuilder::getPointerType((PointerBuilder *)local_2e8);
            if (PVar13 != NULL_) {
              local_228.pointer = (WirePointer *)(aStack_280.value.builder.capTable + 4);
              local_228.capTable = (CapTableBuilder *)aStack_280.value.builder.tag.content;
              capnp::_::PointerBuilder::disown((OrphanBuilder *)local_2e8,&local_228);
              local_308.segment = (SegmentBuilder *)local_2e8._8_8_;
              local_308.capTable = (CapTableBuilder *)local_2e8._16_8_;
              local_308.location = (word *)local_2e8._24_8_;
              local_308.tag.content = local_2e8._0_8_;
              local_2e8._16_8_ = local_258.pointers + 4;
              local_2e8._0_8_ = local_258.segment;
              local_2e8._8_8_ = local_258.capTable;
              capnp::_::PointerBuilder::adopt((PointerBuilder *)local_2e8,&local_308);
              if (local_308.segment != (SegmentBuilder *)0x0) {
                capnp::_::OrphanBuilder::euthanize(&local_308);
              }
            }
          }
        }
        else if (sVar1 == 0xd) {
          local_228.pointer = (WirePointer *)(aStack_280.value.builder.capTable + 5);
          local_228.capTable = (CapTableBuilder *)aStack_280.value.builder.tag.content;
          capnp::_::PointerBuilder::disown((OrphanBuilder *)local_2e8,&local_228);
          uVar8 = local_2e8._24_8_;
          uVar4 = local_2e8._16_8_;
          uVar3 = local_2e8._0_8_;
          local_308.segment = (SegmentBuilder *)local_2e8._8_8_;
          local_308.capTable = (CapTableBuilder *)local_2e8._16_8_;
          local_308.location = (word *)local_2e8._24_8_;
          local_308.tag.content = local_2e8._0_8_;
          pSVar17 = (SegmentBuilder *)local_2e8._8_8_;
          if (local_2b8.builder.pos == local_2b8.builder.endPtr) {
            local_1d8 = (SegmentBuilder *)local_2e8._8_8_;
            sVar19 = (long)local_2b8.builder.pos - (long)local_2b8.builder.ptr >> 4;
            if (local_2b8.builder.pos == local_2b8.builder.ptr) {
              sVar19 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
            setCapacity(&local_2b8,sVar19);
            pSVar17 = local_1d8;
          }
          ((local_2b8.builder.pos)->builder).segment = pSVar17;
          ((local_2b8.builder.pos)->builder).capTable = (CapTableBuilder *)uVar4;
          ((local_2b8.builder.pos)->builder).location = (word *)uVar8;
          ((local_2b8.builder.pos)->builder).tag.content = uVar3;
          local_2b8.builder.pos = local_2b8.builder.pos + 1;
        }
        else {
          if (local_328.builder.pos == local_328.builder.endPtr) {
            sVar19 = (long)local_328.builder.pos - (long)local_328.builder.ptr >> 4;
            if (local_328.builder.pos == local_328.builder.ptr) {
              sVar19 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity(&local_328,sVar19)
            ;
          }
          ((local_328.builder.pos)->builder).segment = local_348;
          ((local_328.builder.pos)->builder).capTable = (CapTableBuilder *)pWStack_340;
          ((local_328.builder.pos)->builder).location = local_338;
          ((local_328.builder.pos)->builder).tag.content = local_358._8_8_;
          local_348 = (SegmentBuilder *)0x0;
          local_338 = (word *)0x0;
          local_328.builder.pos = local_328.builder.pos + 1;
        }
        bVar12 = local_358[0];
      }
      if (((bVar12 & 1) != 0) && (local_348 != (SegmentBuilder *)0x0)) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_358 + 8));
      }
      index = index + 1;
    } while (LVar2 != index);
  }
  if (*local_258.data != 1) {
    i = (WirePointer)generateRandomId();
    local_348 = (SegmentBuilder *)(local_258.pointers + 1);
    *(short *)local_258.data = 1;
    local_358._0_8_ = local_258.segment;
    local_358._8_8_ = local_258.capTable;
    capnp::_::PointerBuilder::initStruct
              ((StructBuilder *)&local_208,(PointerBuilder *)local_358,(StructSize)0x2);
    *(WirePointer *)local_208.data = i;
    iVar14 = (*local_290->_vptr_ErrorReporter[1])();
    if ((char)iVar14 == '\0') {
      kj::hex((CappedArray<char,_17UL> *)&local_208,(unsigned_long)i);
      kj::str<char_const(&)[91],kj::CappedArray<char,17ul>,char_const(&)[2]>
                ((String *)local_358,
                 (kj *)
                 "File does not declare an ID.  I\'ve generated one for you.  Add this line to your file: @0x"
                 ,(char (*) [91])&local_208,(CappedArray<char,_17UL> *)";",params_2);
      pSVar17 = (SegmentBuilder *)local_358._0_8_;
      if ((SegmentBuilder *)local_358._8_8_ == (SegmentBuilder *)0x0) {
        pSVar17 = (SegmentBuilder *)0x2781dd;
      }
      (**local_290->_vptr_ErrorReporter)
                (local_290,0,0,pSVar17,
                 (char *)((long)&((SegmentReader *)local_358._8_8_)->arena +
                         (ulong)((SegmentBuilder *)local_358._8_8_ == (SegmentBuilder *)0x0)));
      uVar4 = local_358._8_8_;
      uVar3 = local_358._0_8_;
      if ((SegmentBuilder *)local_358._0_8_ != (SegmentBuilder *)0x0) {
        local_358._0_8_ = (SegmentBuilder *)0x0;
        local_358._8_8_ = (SegmentBuilder *)0x0;
        (*(code *)((local_348->super_SegmentReader).arena)->_vptr_Arena)
                  (local_348,uVar3,1,uVar4,uVar4,0);
      }
    }
  }
  local_208.data = local_258.pointers + 2;
  local_208.segment = &(local_258.segment)->super_SegmentReader;
  local_208.capTable = &(local_258.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_288,(PointerBuilder *)&local_208,
             (ElementCount)((ulong)((long)local_328.builder.pos - (long)local_328.builder.ptr) >> 5)
             ,(StructSize)0x80002);
  if (local_328.builder.pos != local_328.builder.ptr) {
    lVar18 = 0;
    uVar20 = 0;
    do {
      pOVar5 = local_328.builder.ptr;
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&local_208,(ListBuilder *)local_288,(ElementCount)uVar20);
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_358,
                 (OrphanBuilder *)((long)&(pOVar5->builder).tag.content + lVar18),(StructSize)0x0);
      other.capTable = (CapTableBuilder *)local_358._8_8_;
      other.segment = (SegmentBuilder *)local_358._0_8_;
      other.data = local_348;
      other.pointers = pWStack_340;
      other._32_8_ = local_338;
      capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_208,other);
      uVar20 = uVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (uVar20 < (ulong)((long)local_328.builder.pos - (long)local_328.builder.ptr >> 5));
  }
  local_208.data = local_258.pointers + 3;
  local_208.segment = &(local_258.segment)->super_SegmentReader;
  local_208.capTable = &(local_258.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_2e8,(PointerBuilder *)&local_208,
             (ElementCount)((ulong)((long)local_2b8.builder.pos - (long)local_2b8.builder.ptr) >> 5)
             ,(StructSize)0x20001);
  if (local_2b8.builder.pos == local_2b8.builder.ptr) {
    uVar20 = 0;
  }
  else {
    lVar18 = 0;
    uVar21 = 0;
    do {
      pOVar9 = local_2b8.builder.ptr;
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&local_208,(ListBuilder *)local_2e8,(ElementCount)uVar21);
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_358,
                 (OrphanBuilder *)((long)&(pOVar9->builder).tag.content + lVar18),(StructSize)0x0);
      other_00.capTable = (CapTableBuilder *)local_358._8_8_;
      other_00.segment = (SegmentBuilder *)local_358._0_8_;
      other_00.data = local_348;
      other_00.pointers = pWStack_340;
      other_00._32_8_ = local_338;
      capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_208,other_00);
      uVar21 = uVar21 + 1;
      uVar20 = (long)local_2b8.builder.pos - (long)local_2b8.builder.ptr >> 5;
      lVar18 = lVar18 + 0x20;
    } while (uVar21 < uVar20);
  }
  pOVar9 = local_2b8.builder.ptr;
  if (local_2b8.builder.ptr != (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0) {
    local_2b8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    local_2b8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    lVar18 = (long)local_2b8.builder.endPtr - (long)pOVar9;
    local_2b8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    (**(local_2b8.builder.disposer)->_vptr_ArrayDisposer)
              (local_2b8.builder.disposer,pOVar9,0x20,uVar20,lVar18 >> 5,
               kj::ArrayDisposer::
               Dispose_<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>,_false>::
               destruct);
  }
  pOVar7 = local_328.builder.endPtr;
  pRVar6 = local_328.builder.pos;
  pOVar5 = local_328.builder.ptr;
  if (local_328.builder.ptr != (Orphan<capnp::compiler::Declaration> *)0x0) {
    local_328.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
    local_328.builder.pos = (Orphan<capnp::compiler::Declaration> *)0x0;
    local_328.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
    (**(local_328.builder.disposer)->_vptr_ArrayDisposer)
              (local_328.builder.disposer,pOVar5,0x20,(long)pRVar6 - (long)pOVar5 >> 5,
               (long)pOVar7 - (long)pOVar5 >> 5,
               kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>,_false>::
               destruct);
  }
  kj::Arena::~Arena(&local_1c8.arena);
  return;
}

Assistant:

void parseFile(List<Statement>::Reader statements, ParsedFile::Builder result,
               ErrorReporter& errorReporter) {
  CapnpParser parser(Orphanage::getForMessageContaining(result), errorReporter);

  kj::Vector<Orphan<Declaration>> decls(statements.size());
  kj::Vector<Orphan<Declaration::AnnotationApplication>> annotations;

  auto fileDecl = result.getRoot();
  fileDecl.setFile(VOID);

  for (auto statement: statements) {
    KJ_IF_MAYBE(decl, parser.parseStatement(statement, parser.getParsers().fileLevelDecl)) {
      Declaration::Builder builder = decl->get();
      switch (builder.which()) {
        case Declaration::NAKED_ID:
          if (fileDecl.getId().isUid()) {
            errorReporter.addError(builder.getStartByte(), builder.getEndByte(),
                                   "File can only have one ID.");
          } else {
            fileDecl.getId().adoptUid(builder.disownNakedId());
            if (builder.hasDocComment()) {
              fileDecl.adoptDocComment(builder.disownDocComment());
            }
          }
          break;
        case Declaration::NAKED_ANNOTATION:
          annotations.add(builder.disownNakedAnnotation());
          break;
        default:
          decls.add(kj::mv(*decl));
          break;
      }
    }
  }

  if (fileDecl.getId().which() != Declaration::Id::UID) {
    // We didn't see an ID. Generate one randomly for now.
    uint64_t id = generateRandomId();
    fileDecl.getId().initUid().setValue(id);

    // Don't report missing ID if there was a parse error, because quite often the parse error
    // prevents us from parsing the ID even though it is actually there.
    if (!errorReporter.hadErrors()) {
      errorReporter.addError(0, 0,
          kj::str("File does not declare an ID.  I've generated one for you.  Add this line to "
                  "your file: @0x", kj::hex(id), ";"));
    }
  }

  auto declsBuilder = fileDecl.initNestedDecls(decls.size());
  for (size_t i = 0; i < decls.size(); i++) {
    declsBuilder.adoptWithCaveats(i, kj::mv(decls[i]));
  }

  auto annotationsBuilder = fileDecl.initAnnotations(annotations.size());
  for (size_t i = 0; i < annotations.size(); i++) {
    annotationsBuilder.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
}